

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

ValueType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::FindId(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this,ValueType *doc,UriType *finduri,PointerType *resptr,UriType *baseuri,bool full,
        PointerType *here)

{
  Pointer this_00;
  ushort uVar1;
  bool bVar2;
  ConstMemberIterator CVar3;
  ValueIterator pGVar4;
  Ch *pCVar5;
  ValueType *pVVar6;
  ushort uVar7;
  ValueType *pVVar8;
  SizeType index;
  UriType localuri;
  UriType tempuri;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_158;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_110;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_c8;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_78;
  
  local_78.allocator_ = this->allocator_;
  local_78.frag_ = (Ch *)0x0;
  local_78.path_ = (Ch *)0x0;
  local_78.query_ = (Ch *)0x0;
  local_78.scheme_ = (Ch *)0x0;
  local_78.auth_ = (Ch *)0x0;
  local_78.uri_ = (Ch *)0x0;
  local_78.base_ = (Ch *)0x0;
  local_78.ownAllocator_ = (CrtAllocator *)0x0;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::operator=(&local_78,finduri);
  local_c8.allocator_ = this->allocator_;
  local_c8.frag_ = (Ch *)0x0;
  local_c8.path_ = (Ch *)0x0;
  local_c8.query_ = (Ch *)0x0;
  local_c8.scheme_ = (Ch *)0x0;
  local_c8.auth_ = (Ch *)0x0;
  local_c8.uri_ = (Ch *)0x0;
  local_c8.base_ = (Ch *)0x0;
  local_c8.ownAllocator_ = (CrtAllocator *)0x0;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::operator=(&local_c8,baseuri);
  uVar1 = (doc->data_).f.flags;
  uVar7 = uVar1 & 7;
  if (uVar7 == 4) {
    if (uVar1 != 4) {
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x68d,
                    "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    pVVar8 = (ValueType *)((ulong)(doc->data_).s.str & 0xffffffffffff);
    pGVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(doc);
    if (pGVar4 != pVVar8) {
      index = 0;
      do {
        if (((pVVar8->data_).f.flags & 7) - 3 < 2) {
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::Append((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                    *)&local_158,here,index,this->allocator_);
          pVVar6 = FindId(this,pVVar8,finduri,resptr,&local_c8,full,(PointerType *)&local_158);
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                             *)&local_158);
          if (pVVar6 != (ValueType *)0x0) goto LAB_0014106f;
        }
        index = index + 1;
        pVVar8 = pVVar8 + 1;
        pGVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::End(doc);
      } while (pVVar8 != pGVar4);
    }
  }
  else if (uVar7 == 3) {
    internal::
    Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
    ::GetIdString();
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&local_158,doc);
    CVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(doc);
    if (((Pointer)local_158.uri_ != CVar3.ptr_) &&
       (((((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)((long)local_158.uri_ + 0x10))->data_).f.flags & 7) == 5)) {
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
      ::
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                  *)&local_110,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)((long)local_158.uri_ + 0x10),this->allocator_);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::Resolve(&local_158,&local_110,baseuri,this->allocator_);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::operator=(&local_c8,&local_158);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_158);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_110);
    }
    bVar2 = GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
            ::Match(&local_c8,finduri,full);
    if (bVar2) {
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::operator=(resptr,here);
      pVVar6 = doc;
      goto LAB_0014106f;
    }
    if ((doc->data_).f.flags != 3) {
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0x4f4,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    pVVar8 = (ValueType *)(((ulong)(doc->data_).s.str & 0xffffffffffff) + 0x10);
    while( true ) {
      CVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::MemberEnd(doc);
      this_00 = (Pointer)(pVVar8 + -1);
      if (this_00 == CVar3.ptr_) break;
      if (((pVVar8->data_).f.flags & 7) - 3 < 2) {
        pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              *)this_00);
        local_110.base_._0_4_ =
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)this_00);
        local_110.base_._4_4_ = 0xffffffff;
        local_110.uri_ = pCVar5;
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::Append((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *)&local_158,here,(Token *)&local_110,this->allocator_);
        pVVar6 = FindId(this,pVVar8,finduri,resptr,&local_c8,full,(PointerType *)&local_158);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                           *)&local_158);
        if (pVVar6 != (ValueType *)0x0) goto LAB_0014106f;
      }
      pVVar8 = pVVar8 + 2;
    }
  }
  pVVar6 = (ValueType *)0x0;
LAB_0014106f:
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&local_c8);
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::~GenericUri(&local_78);
  return pVVar6;
}

Assistant:

ValueType* FindId(const ValueType& doc, const UriType& finduri, PointerType& resptr, const UriType& baseuri, bool full, const PointerType& here = PointerType()) const {
        SizeType i = 0;
        ValueType* resval = 0;
        UriType tempuri = UriType(finduri, allocator_);
        UriType localuri = UriType(baseuri, allocator_);
        if (doc.GetType() == kObjectType) {
            // Establish the base URI of this object
            typename ValueType::ConstMemberIterator m = doc.FindMember(SchemaType::GetIdString());
            if (m != doc.MemberEnd() && m->value.GetType() == kStringType) {
                localuri = UriType(m->value, allocator_).Resolve(baseuri, allocator_);
            }
            // See if it matches
            if (localuri.Match(finduri, full)) {
                RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaDocument::FindId (match)", full ? localuri.GetString() : localuri.GetBaseString());
                resval = const_cast<ValueType *>(&doc);
                resptr = here;
                return resval;
            }
            // No match, continue looking
            for (m = doc.MemberBegin(); m != doc.MemberEnd(); ++m) {
                if (m->value.GetType() == kObjectType || m->value.GetType() == kArrayType) {
                    resval = FindId(m->value, finduri, resptr, localuri, full, here.Append(m->name.GetString(), m->name.GetStringLength(), allocator_));
                }
                if (resval) break;
            }
        } else if (doc.GetType() == kArrayType) {
            // Continue looking
            for (typename ValueType::ConstValueIterator v = doc.Begin(); v != doc.End(); ++v) {
                if (v->GetType() == kObjectType || v->GetType() == kArrayType) {
                    resval = FindId(*v, finduri, resptr, localuri, full, here.Append(i, allocator_));
                }
                if (resval) break;
                i++;
            }
        }
        return resval;
    }